

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall xmrig::FailoverStrategy::stop(FailoverStrategy *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  *in_RDI;
  IClient **pool;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *__range1;
  vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  local_18;
  __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 6;
  local_18._M_current =
       (IClient **)
       std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
              ::operator*(&local_18);
    (*(*ppIVar2)->_vptr_IClient[2])();
    __gnu_cxx::
    __normal_iterator<xmrig::IClient_**,_std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>_>
    ::operator++(&local_18);
  }
  in_RDI[5]._M_current = (IClient **)0x0;
  *(undefined4 *)((long)&in_RDI[3]._M_current + 4) = 0xffffffff;
  (*(code *)(*in_RDI[4]._M_current)[5]._vptr_IClient)();
  return;
}

Assistant:

void xmrig::FailoverStrategy::stop()
{
    for (auto &pool : m_pools) {
        pool->disconnect();
    }

    m_index  = 0;
    m_active = -1;

    m_listener->onPause(this);
}